

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O0

void __thiscall
cppjieba::MixSegment::Cut
          (MixSegment *this,string *sentence,
          vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *words,bool hmm)

{
  bool bVar1;
  Range RVar2;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> wrs;
  Range range;
  PreFilter pre_filter;
  PreFilter *in_stack_fffffffffffffe00;
  const_iterator in_stack_fffffffffffffe10;
  undefined1 *__n;
  const_iterator in_stack_fffffffffffffe30;
  undefined1 local_1b0 [16];
  pointer in_stack_fffffffffffffe60;
  const_iterator in_stack_fffffffffffffe68;
  const_iterator in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffee7;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *in_stack_fffffffffffffee8;
  const_iterator in_stack_fffffffffffffef0;
  const_iterator in_stack_fffffffffffffef8;
  MixSegment *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffffa0;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffffa8;
  PreFilter *in_stack_ffffffffffffffb0;
  
  PreFilter::PreFilter
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  __n = local_1b0;
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::vector
            ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)0x158d8f);
  std::__cxx11::string::size();
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::reserve
            ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
             in_stack_fffffffffffffe30,(size_type)__n);
  RVar2.end = in_stack_fffffffffffffe70;
  RVar2.begin = in_stack_fffffffffffffe10;
  while( true ) {
    bVar1 = PreFilter::HasNext(in_stack_fffffffffffffe00);
    if (!bVar1) break;
    RVar2 = PreFilter::Next(in_stack_fffffffffffffe00);
    in_stack_fffffffffffffe30 = RVar2.begin;
    in_stack_fffffffffffffe68 = in_stack_fffffffffffffe30;
    Cut(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
        in_stack_fffffffffffffee8,(bool)in_stack_fffffffffffffee7);
  }
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::clear
            ((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)0x158e68);
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::size
            ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)local_1b0);
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::reserve
            ((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)in_stack_fffffffffffffe30,
             (size_type)__n);
  GetWordsFromWordRanges
            ((string *)RVar2.end,
             (vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
             in_stack_fffffffffffffe68,
             (vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)in_stack_fffffffffffffe60);
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::~vector
            ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)RVar2.begin);
  PreFilter::~PreFilter((PreFilter *)0x158ec1);
  return;
}

Assistant:

void Cut(const string& sentence, vector<Word>& words, bool hmm = true) const {
    PreFilter pre_filter(symbols_, sentence);
    PreFilter::Range range;
    vector<WordRange> wrs;
    wrs.reserve(sentence.size() / 2);
    while (pre_filter.HasNext()) {
      range = pre_filter.Next();
      Cut(range.begin, range.end, wrs, hmm);
    }
    words.clear();
    words.reserve(wrs.size());
    GetWordsFromWordRanges(sentence, wrs, words);
  }